

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine_with_internal_transitions.cpp
# Opt level: O1

void __thiscall
afsm::test::FSM_MachineWithInstateDefers_Test::TestBody(FSM_MachineWithInstateDefers_Test *this)

{
  bool bVar1;
  event_process_result eVar2;
  char *pcVar3;
  char *in_R9;
  internal iVar4;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  test_sm tsm;
  AssertHelper local_190;
  AssertHelper local_188;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  string local_170;
  state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  local_150;
  
  state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::state_machine(&local_150);
  detail::observer_wrapper<afsm::test::test_fsm_observer>::make_observer<char_const(&)[5]>
            (&local_150.super_observer_wrapper<afsm::test::test_fsm_observer>,(char (*) [5])0x3f4650
            );
  iVar4 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ptr_._0_1_ = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x69,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_1_ =
       (internal)
       (local_150.
        super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        .super_type.
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
        .
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
        .transitions_.current_state_ != 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 0) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x6a,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_4_ = 3;
  eVar2 = state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::a_to_b>(&local_150,(a_to_b *)&local_188);
  local_190.data_._0_4_ = eVar2;
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::process",
             "tsm.process_event(events::a_to_b{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_180.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_180.ptr_ + 8))();
      }
      local_180.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar4 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ptr_._0_1_ = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x70,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_1_ =
       (internal)
       (local_150.
        super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        .super_type.
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
        .
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
        .transitions_.current_state_ != 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 1) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x71,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_4_ = 2;
  eVar2 = state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::in_state>(&local_150,(in_state *)&local_188);
  local_190.data_._0_4_ = eVar2;
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::process_in_state",
             "tsm.process_event(events::in_state{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_180.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_180.ptr_ + 8))();
      }
      local_180.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar4 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ptr_._0_1_ = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x76,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_1_ =
       (internal)
       (local_150.
        super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        .super_type.
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
        .
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
        .transitions_.current_state_ != 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 1) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x77,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_4_ = 1;
  eVar2 = state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::a_to_b>(&local_150,(a_to_b *)&local_188);
  local_190.data_._0_4_ = eVar2;
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::defer",
             "tsm.process_event(events::a_to_b{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_180.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_180.ptr_ + 8))();
      }
      local_180.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_4_ = 1;
  eVar2 = state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::a_to_b>(&local_150,(a_to_b *)&local_188);
  local_190.data_._0_4_ = eVar2;
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::defer",
             "tsm.process_event(events::a_to_b{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x7c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_180.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_180.ptr_ + 8))();
      }
      local_180.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar4 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ptr_._0_1_ = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x7e,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_1_ =
       (internal)
       (local_150.
        super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        .super_type.
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
        .
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
        .transitions_.current_state_ != 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 1) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x7f,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_4_ = 2;
  eVar2 = state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::in_state>(&local_150,(in_state *)&local_188);
  local_190.data_._0_4_ = eVar2;
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::process_in_state",
             "tsm.process_event(events::in_state{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_180.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_180.ptr_ + 8))();
      }
      local_180.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar4 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ptr_._0_1_ = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x84,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_1_ =
       (internal)
       (local_150.
        super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        .super_type.
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
        .
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
        .transitions_.current_state_ != 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 1) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x85,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_4_ = 3;
  eVar2 = state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::b_to_a>(&local_150,(b_to_a *)&local_188);
  local_190.data_._0_4_ = eVar2;
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::process",
             "tsm.process_event(events::b_to_a{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x89,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_180.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_180.ptr_ + 8))();
      }
      local_180.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar4 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ptr_._0_1_ = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x8b,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_1_ =
       (internal)
       (local_150.
        super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        .super_type.
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
        .
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
        .transitions_.current_state_ != 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 1) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x8c,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_4_ = 2;
  eVar2 = state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::in_state>(&local_150,(in_state *)&local_188);
  local_190.data_._0_4_ = eVar2;
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::process_in_state",
             "tsm.process_event(events::in_state{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x8f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_180.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_180.ptr_ + 8))();
      }
      local_180.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar4 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ptr_._0_1_ = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x91,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_1_ =
       (internal)
       (local_150.
        super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        .super_type.
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
        .
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
        .transitions_.current_state_ != 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 1) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x92,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_4_ = 3;
  eVar2 = state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          ::process_event<afsm::test::events::b_to_a>(&local_150,(b_to_a *)&local_188);
  local_190.data_._0_4_ = eVar2;
  testing::internal::
  CmpHelperEQ<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((internal *)&local_170,"actions::event_process_result::process",
             "tsm.process_event(events::b_to_a{})",(event_process_result *)&local_180,
             (event_process_result *)&local_190);
  if ((char)local_170._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_180);
    if ((undefined8 *)local_170._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_170._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_180.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_180.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_180.ptr_ + 8))();
      }
      local_180.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_170._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar4 = (internal)
          (local_150.
           super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           .super_type.
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
           .
           super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
           .transitions_.current_state_ == 0);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_180.ptr_._0_1_ = iVar4;
  if (!(bool)iVar4) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_b >()","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x98,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_180.ptr_._0_1_ =
       (internal)
       (local_150.
        super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
        .super_type.
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
        .
        super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
        .transitions_.current_state_ != 1);
  local_178.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_150.
      super_state_machine_base<afsm::test::outer_machine,_afsm::none,_afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
      .super_type.
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long>
      .
      super_transition_container<afsm::state_machine<afsm::test::outer_machine,_afsm::none,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::outer_machine,_unsigned_long,_false>
      .transitions_.current_state_ == 1) {
    testing::Message::Message((Message *)&local_190);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&local_180,
               (AssertionResult *)"tsm.is_in_state< outer_machine::state_a >()","true","false",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/state_machine_with_internal_transitions.cpp"
               ,0x99,(char *)CONCAT71(local_170._M_dataplus._M_p._1_7_,
                                      (char)local_170._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p) !=
        &local_170.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_170._M_dataplus._M_p._1_7_,(char)local_170._M_dataplus._M_p),
                      local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_190.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_190.data_ + 8))();
      }
      local_190.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_178,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_150.deferred_event_ids_._M_t);
  std::__cxx11::
  _List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ::_M_clear(&local_150.deferred_events_.
              super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
            );
  std::
  deque<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ::~deque(&local_150.queued_events_);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_150.deferred_._M_t);
  std::
  _Rb_tree<const_afsm::detail::event_base::id_type_*,_const_afsm::detail::event_base::id_type_*,_std::_Identity<const_afsm::detail::event_base::id_type_*>,_std::less<const_afsm::detail::event_base::id_type_*>,_std::allocator<const_afsm::detail::event_base::id_type_*>_>
  ::~_Rb_tree(&local_150.handled_._M_t);
  if (local_150.super_observer_wrapper<afsm::test::test_fsm_observer>.observer_.
      super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.super_observer_wrapper<afsm::test::test_fsm_observer>.observer_.
               super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(FSM, MachineWithInstateDefers)
{
    test_sm tsm;
    tsm.make_observer("test");
    // *** INITIAL STATE ***
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_a >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_b >());
    // *** A -> B ***
    // Process with transition
    EXPECT_EQ( actions::event_process_result::process,
            tsm.process_event(events::a_to_b{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_b >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_a >());
    // Process in-state
    EXPECT_EQ( actions::event_process_result::process_in_state,
            tsm.process_event(events::in_state{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_b >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_a >());
    // Defer events
    EXPECT_EQ( actions::event_process_result::defer,
            tsm.process_event(events::a_to_b{}));
    EXPECT_EQ( actions::event_process_result::defer,
            tsm.process_event(events::a_to_b{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_b >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_a >());
    // Process in-state
    EXPECT_EQ( actions::event_process_result::process_in_state,
            tsm.process_event(events::in_state{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_b >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_a >());
    // *** B -> A -> B ***
    // Process with transition
    EXPECT_EQ( actions::event_process_result::process,
            tsm.process_event(events::b_to_a{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_b >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_a >());
    // Process in-state
    EXPECT_EQ( actions::event_process_result::process_in_state,
            tsm.process_event(events::in_state{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_b >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_a >());
    // *** B -> A -> B ***
    // Process with transition
    EXPECT_EQ( actions::event_process_result::process,
            tsm.process_event(events::b_to_a{}));
    // Check current state
    EXPECT_TRUE(tsm.is_in_state< outer_machine::state_b >());
    EXPECT_FALSE(tsm.is_in_state< outer_machine::state_a >());
}